

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

void __thiscall
ot::commissioner::DtlsSession::DtlsSession
          (DtlsSession *this,event_base *aEventBase,bool aIsServer,SocketPtr *aSocket)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  DtlsSession *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  (this->super_Endpoint).mReceiver.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Endpoint).mReceiver._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->super_Endpoint).mReceiver.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Endpoint).mReceiver.super__Function_base._M_functor + 8) = 0;
  (this->super_Endpoint)._vptr_Endpoint = (_func_int **)&PTR__DtlsSession_002b9a20;
  (this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (aSocket->super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (aSocket->super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(ot::commissioner::Timer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp:119:35)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(ot::commissioner::Timer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp:119:35)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  DtlsTimer::DtlsTimer(&this->mHandshakeTimer,aEventBase,(Action *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  this->mState = kOpen;
  this->mIsServer = aIsServer;
  this->mIsClientIdSet = false;
  memset(&this->mKek,0,0x88);
  std::
  _Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
                       *)&this->mSendQueue,0);
  (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_70 = 0;
  pcStack_60 = std::
               _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp:123:30)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp:123:30)>
             ::_M_manager;
  local_78 = this;
  (*((this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->_vptr_Socket[8])();
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  InitMbedtls(this);
  return;
}

Assistant:

DtlsSession::DtlsSession(struct event_base *aEventBase, bool aIsServer, SocketPtr aSocket)
    : mSocket(aSocket)
    , mHandshakeTimer(aEventBase, [this](Timer &aTimer) { HandshakeTimerCallback(aTimer); })
    , mState(State::kOpen)
    , mIsServer(aIsServer)
{
    mSocket->SetEventHandler([this](short aFlags) { HandleEvent(aFlags); });
    InitMbedtls();
}